

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBuffer::~MemoryQualifierInstanceBuffer
          (MemoryQualifierInstanceBuffer *this)

{
  ~MemoryQualifierInstanceBuffer(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual				~MemoryQualifierInstanceBuffer	(void) {}